

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

CGraph * __thiscall Escape::CGraph::renameByDegreeOrder(CGraph *__return_storage_ptr__,CGraph *this)

{
  long *plVar1;
  ulong uVar2;
  EdgeIdx *pEVar3;
  long lVar4;
  EdgeIdx *pEVar5;
  VertexIdx *pVVar6;
  Pair *__first;
  void *pvVar7;
  void *pvVar8;
  VertexIdx *pVVar9;
  long lVar10;
  Pair *pPVar11;
  long lVar12;
  EdgeIdx EVar13;
  ulong uVar14;
  
  newCGraph(__return_storage_ptr__,this->nVertices,this->nEdges);
  uVar2 = this->nVertices;
  __first = (Pair *)operator_new__(-(ulong)(uVar2 >> 0x3c != 0) | uVar2 * 0x10);
  uVar14 = -(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8;
  pvVar7 = operator_new__(uVar14);
  pvVar8 = operator_new__(uVar14);
  if (0 < (long)uVar2) {
    pEVar3 = this->offsets;
    pVVar9 = &__first->second;
    uVar14 = 0;
    do {
      ((Pair *)(pVVar9 + -1))->first = uVar14;
      lVar12 = uVar14 + 1;
      plVar1 = pEVar3 + uVar14;
      uVar14 = uVar14 + 1;
      *pVVar9 = pEVar3[lVar12] - *plVar1;
      pVVar9 = pVVar9 + 2;
    } while (uVar2 != uVar14);
  }
  if (uVar2 != 0) {
    lVar12 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<Escape::Pair*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Escape::Pair,Escape::Pair)>>
              (__first,__first + uVar2,(ulong)(((uint)lVar12 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(Escape::Pair,_Escape::Pair)>)0x10e2c4);
    std::
    __final_insertion_sort<Escape::Pair*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Escape::Pair,Escape::Pair)>>
              (__first,__first + uVar2,
               (_Iter_comp_iter<bool_(*)(Escape::Pair,_Escape::Pair)>)0x10e2c4);
  }
  lVar12 = this->nVertices;
  if (0 < lVar12) {
    lVar10 = 0;
    pPVar11 = __first;
    do {
      lVar4 = pPVar11->first;
      *(long *)((long)pvVar7 + lVar4 * 8) = lVar10;
      *(long *)((long)pvVar8 + lVar10 * 8) = lVar4;
      lVar10 = lVar10 + 1;
      pPVar11 = pPVar11 + 1;
    } while (lVar12 != lVar10);
  }
  pEVar3 = __return_storage_ptr__->offsets;
  *pEVar3 = 0;
  if (0 < this->nVertices) {
    pEVar5 = this->offsets;
    pVVar9 = this->nbors;
    pVVar6 = __return_storage_ptr__->nbors;
    lVar12 = 0;
    lVar10 = 0;
    do {
      lVar4 = *(long *)((long)pvVar8 + lVar10 * 8);
      for (EVar13 = pEVar5[lVar4]; EVar13 < pEVar5[lVar4 + 1]; EVar13 = EVar13 + 1) {
        pVVar6[lVar12] = *(VertexIdx *)((long)pvVar7 + pVVar9[EVar13] * 8);
        lVar12 = lVar12 + 1;
      }
      pEVar3[lVar10 + 1] = lVar12;
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->nVertices);
  }
  operator_delete__(pvVar7);
  operator_delete__(pvVar8);
  operator_delete__(__first);
  return __return_storage_ptr__;
}

Assistant:

CGraph CGraph::renameByDegreeOrder() const {
    CGraph ret = newCGraph(nVertices, nEdges);
    Pair *deg_info = new Pair[nVertices];

    VertexIdx *mapping = new VertexIdx[nVertices];
    VertexIdx *inverse = new VertexIdx[nVertices];

    // Construct array of pairs, storing old vertex label and degree
    for (VertexIdx i = 0; i < nVertices; i++) {
        deg_info[i].first = i;
        deg_info[i].second = offsets[i + 1] - offsets[i];
    }

    // sort the pairs by degree (if degree is same, sort by old vertex label)
    std::sort(deg_info, deg_info + nVertices, Escape::pairCompareSecond);

    // Construct the mapping of old vertex label to new vertex label
    // So mapping[i] is what i is mapped to
    // And inverse[i] is what maps to i
    for (VertexIdx i = 0; i < nVertices; i++) {
        mapping[deg_info[i].first] = i;
        inverse[i] = deg_info[i].first;
    }

    // Initialize offsets of output CGraph
    ret.offsets[0] = 0;
    EdgeIdx current = 0;


    // Loop over new vertices
    for (VertexIdx new_label = 0; new_label < nVertices; new_label++) {
        VertexIdx old_label = inverse[new_label]; // corresponding old label for new vertices
        for (EdgeIdx pos = offsets[old_label]; pos < offsets[old_label + 1]; pos++) // loop over neighbors of old label
        {
            VertexIdx old_nbr = nbors[pos];
            VertexIdx new_nbr = mapping[old_nbr]; //corresponding new neighbor
            ret.nbors[current] = new_nbr; // insert new neighbor in nbors of output
            current++;
        }
        ret.offsets[new_label +
                    1] = current; // all neighbors of new_label have been added, so we set offset for new_label+1
    }

    delete[] mapping;
    delete[] inverse;
    delete[] deg_info;
    return ret;
}